

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

int32 Js::JavascriptMath::ToInt32_Full(Var aValue,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  ulong uVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  bool bVar8;
  
  uVar7 = (ulong)aValue & 0xffff000000000000;
  bVar8 = ((ulong)aValue & 0x1ffff00000000) == 0x1000000000000;
  if (!bVar8 && uVar7 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00aa1cc9;
    *puVar6 = 0;
LAB_00aa1a45:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x567,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar3) goto LAB_00aa1cc9;
    *puVar6 = 0;
    if (aValue == (Var)0x0) {
LAB_00aa1aed:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar8) goto LAB_00aa1cc9;
      *puVar6 = 0;
LAB_00aa1b30:
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar8) goto LAB_00aa1cc9;
        *puVar6 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 != TypeIds_Number) goto LAB_00aa1cb0;
        goto LAB_00aa1bae;
      }
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 != 0) goto LAB_00aa1cb0;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      error = "(typeId < TypeIds_Limit || obj->IsExternal())";
      message = "GetTypeId aValue has invalid TypeId";
      lineNumber = 0xe;
    }
    else {
      if (bVar8 || uVar7 != 0x1000000000000) goto LAB_00aa1cb0;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
    }
    bVar8 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (bVar8) {
      *puVar6 = 0;
LAB_00aa1cb0:
      iVar5 = JavascriptConversion::ToInt32_Full(aValue,scriptContext);
      return iVar5;
    }
LAB_00aa1cc9:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (uVar7 == 0x1000000000000) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    goto LAB_00aa1a45;
  }
  if (aValue == (Var)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    goto LAB_00aa1aed;
  }
  if ((ulong)aValue >> 0x32 == 0) goto LAB_00aa1b30;
LAB_00aa1bae:
  if ((ulong)aValue >> 0x32 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar8) goto LAB_00aa1cc9;
    *puVar6 = 0;
  }
  return (int)(double)((ulong)aValue ^ 0xfffc000000000000);
}

Assistant:

int32 JavascriptMath::ToInt32_Full(Var aValue, ScriptContext* scriptContext)
        {
            AssertMsg(!TaggedInt::Is(aValue), "Should be detected");

            // This is used when TaggedInt's overflow but remain under int32
            // so Number is our most critical case:

            TypeId typeId = JavascriptOperators::GetTypeId(aValue);

            if (typeId == TypeIds_Number)
            {
                return JavascriptMath::ToInt32Core(JavascriptNumber::GetValue(aValue));
            }

            return JavascriptConversion::ToInt32_Full(aValue, scriptContext);
        }